

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>
* __thiscall
gnuplotio::
get_columns_range<std::vector<std::vector<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>,std::allocator<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>,std::allocator<std::vector<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>,std::allocator<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>>>>
          (VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>
           *__return_storage_ptr__,gnuplotio *this,
          vector<std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>_>
          *arg)

{
  vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
  rvec;
  range_type outer;
  vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
  local_58;
  IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_*,_std::vector<std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>_>_>,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
  local_40;
  subiter_type local_30;
  
  local_58.
  super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
        *)0x0;
  local_58.
  super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
        *)0x0;
  local_40.it._M_current =
       *(vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>
         **)this;
  local_40.end._M_current =
       *(vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>
         **)(this + 8);
  if (local_40.it._M_current != local_40.end._M_current) {
    do {
      local_30 = IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_*,_std::vector<std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>_>_>,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
                 ::deref_subiter(&local_40);
      if (local_58.
          super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_58.
          super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>const*,std::vector<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>,std::allocator<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>>,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>const*,std::vector<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>,std::allocator<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>>,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>>
        ::
        _M_realloc_insert<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>const*,std::vector<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>,std::allocator<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>>,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                  ((vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>const*,std::vector<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>,std::allocator<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>>,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>const*,std::vector<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>,std::allocator<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>>,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>>
                    *)&local_58,
                   (iterator)
                   local_58.
                   super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_30);
      }
      else {
        ((local_58.
          super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->it)._M_current = local_30.it._M_current;
        ((local_58.
          super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->end)._M_current = local_30.end._M_current;
        local_58.
        super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_58.
             super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_40.it._M_current = local_40.it._M_current + 1;
    } while (local_40.it._M_current != local_40.end._M_current);
  }
  std::
  vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
  ::vector(&__return_storage_ptr__->rvec,&local_58);
  if (local_58.
      super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

VecOfRange<typename ArrayTraits<T>::range_type::subiter_type>
get_columns_range(const T &arg) {
    typedef typename ArrayTraits<T>::range_type::subiter_type U;
    std::vector<U> rvec;
    typename ArrayTraits<T>::range_type outer = ArrayTraits<T>::get_range(arg);
    while(!outer.is_end()) {
        rvec.push_back(outer.deref_subiter());
        outer.inc();
    }
    VecOfRange<U> ret(rvec);
    return ret;
}